

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O1

s32 __thiscall
irr::gui::CGUIFont::getKerningWidth(CGUIFont *this,wchar_t *thisLetter,wchar_t *previousLetter)

{
  pointer pSVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = this->GlobalKerningWidth;
  if (thisLetter != (wchar_t *)0x0) {
    uVar2 = getAreaFromCharacter(this,*thisLetter);
    pSVar1 = (this->Areas).m_data.
             super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = iVar3 + pSVar1[uVar2].overhang;
    if (previousLetter != (wchar_t *)0x0) {
      uVar2 = getAreaFromCharacter(this,*previousLetter);
      iVar3 = iVar3 + pSVar1[uVar2].underhang;
    }
  }
  return iVar3;
}

Assistant:

s32 CGUIFont::getKerningWidth(const wchar_t *thisLetter, const wchar_t *previousLetter) const
{
	s32 ret = GlobalKerningWidth;

	if (thisLetter) {
		ret += Areas[getAreaFromCharacter(*thisLetter)].overhang;

		if (previousLetter) {
			ret += Areas[getAreaFromCharacter(*previousLetter)].underhang;
		}
	}

	return ret;
}